

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgn.h
# Opt level: O1

bool __thiscall pgn::find_move<(Piece)3>(pgn *this,position *p,Square *to,Move *m,int row,int col)

{
  Square *pSVar1;
  U8 UVar2;
  byte bVar3;
  Square SVar4;
  bool bVar5;
  U8 UVar6;
  U64 UVar7;
  byte bVar8;
  ulong uVar9;
  ulong uVar10;
  Square *s;
  Move *m_00;
  U8 *pUVar11;
  bool bVar12;
  long lVar13;
  Movegen mvs;
  Movegen local_3a8;
  
  Movegen::Movegen(&local_3a8,p);
  if (*local_3a8.rooks != no_square) {
    s = local_3a8.rooks;
    do {
      UVar7 = magics::attacks<(Piece)3>(&local_3a8.all_pieces,s);
      uVar9 = local_3a8.qtarget & UVar7;
      if (uVar9 != 0) {
        SVar4 = *s;
        uVar10 = (ulong)local_3a8.last;
        pUVar11 = &local_3a8.list[uVar10].type;
        do {
          lVar13 = 0;
          if (uVar9 != 0) {
            for (; (uVar9 >> lVar13 & 1) == 0; lVar13 = lVar13 + 1) {
            }
          }
          ((Move *)(pUVar11 + -2))->f = (char)SVar4;
          pUVar11[-1] = (U8)lVar13;
          *pUVar11 = '\n';
          pUVar11 = pUVar11 + 3;
          local_3a8.last = (int)uVar10 + 1;
          uVar10 = (ulong)(uint)local_3a8.last;
          uVar9 = uVar9 & uVar9 - 1;
        } while (uVar9 != 0);
      }
      uVar9 = UVar7 & local_3a8.ctarget;
      if (uVar9 != 0) {
        SVar4 = *s;
        uVar10 = (ulong)local_3a8.last;
        pUVar11 = &local_3a8.list[uVar10].type;
        do {
          lVar13 = 0;
          if (uVar9 != 0) {
            for (; (uVar9 >> lVar13 & 1) == 0; lVar13 = lVar13 + 1) {
            }
          }
          ((Move *)(pUVar11 + -2))->f = (char)SVar4;
          pUVar11[-1] = (U8)lVar13;
          *pUVar11 = '\v';
          pUVar11 = pUVar11 + 3;
          local_3a8.last = (int)uVar10 + 1;
          uVar10 = (ulong)(uint)local_3a8.last;
          uVar9 = uVar9 & uVar9 - 1;
        } while (uVar9 != 0);
      }
      pSVar1 = s + 1;
      s = s + 1;
    } while (*pSVar1 != no_square);
  }
  bVar12 = 0 < local_3a8.last;
  if (0 < local_3a8.last) {
    UVar2 = m->type;
    m_00 = local_3a8.list;
    lVar13 = 0;
    do {
      bVar5 = position::is_legal(p,m_00);
      if (bVar5) {
        if (UVar2 == '\x11') {
          bVar3 = m_00->t;
          if (*to == (uint)bVar3) {
            if (((row < 0) || (bVar8 = m_00->f, (uint)(bVar8 >> 3) != row)) &&
               ((col < 0 || (bVar8 = m_00->f, (bVar8 & 7) != col)))) {
              if (-1 < (col & row)) goto LAB_0011e7a5;
              m->f = m_00->f;
            }
            else {
              m->f = bVar8;
            }
            m->t = bVar3;
            UVar6 = m_00->type;
LAB_0011e7ef:
            m->type = UVar6;
            break;
          }
        }
        else {
          UVar6 = m_00->type;
          if ((m->type == UVar6) && (bVar3 = m_00->t, *to == (uint)bVar3)) {
            if (((row < 0) || (bVar8 = m_00->f, (uint)(bVar8 >> 3) != row)) &&
               ((col < 0 || (bVar8 = m_00->f, (bVar8 & 7) != col)))) {
              if (-1 < (col & row)) goto LAB_0011e7a5;
              m->f = m_00->f;
            }
            else {
              m->f = bVar8;
            }
            m->t = bVar3;
            goto LAB_0011e7ef;
          }
        }
      }
LAB_0011e7a5:
      lVar13 = lVar13 + 1;
      m_00 = m_00 + 1;
      bVar12 = lVar13 < local_3a8.last;
    } while (lVar13 < local_3a8.last);
  }
  Movegen::~Movegen(&local_3a8);
  return bVar12;
}

Assistant:

bool pgn::find_move(position& p, const Square& to, Move& m, int row, int col) {

	Movegen mvs(p);
	mvs.generate<piece>();
	bool promotion = (m.type != Movetype::no_type);


	for (int j = 0; j < mvs.size(); ++j) {

		if (!p.is_legal(mvs[j])) continue;

		if (promotion && m.type == mvs[j].type && mvs[j].t == to) {

			if (row >= 0 && row == util::row(mvs[j].f)) { m = mvs[j]; return true; }
			if (col >= 0 && col == util::col(mvs[j].f)) { m = mvs[j]; return true; }
			if (col < 0 && row < 0) { m = mvs[j]; return true; }
		}

		else if (!promotion && mvs[j].t == to) {
			if (row >= 0 && row == util::row(mvs[j].f)) { m = mvs[j]; return true; }
			if (col >= 0 && col == util::col(mvs[j].f)) { m = mvs[j]; return true; }
			if (col < 0 && row < 0) { m = mvs[j]; return true; }
		}

	}
	return false;
}